

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMockSupportTest::teardown(TEST_GROUP_CppUTestGroupMockSupportTest *this)

{
  MockSupport *pMVar1;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_GROUP_CppUTestGroupMockSupportTest *local_10;
  TEST_GROUP_CppUTestGroupMockSupportTest *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar1 = mock(&local_20,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_20);
  CHECK_NO_MOCK_FAILURE_LOCATION
            ("/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x2b);
  MockFailureReporterForTest::clearReporter();
  SimpleString::SimpleString(local_40,"");
  pMVar1 = mock(local_40,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(local_40);
  return;
}

Assistant:

void teardown() _override
  {
      mock().checkExpectations();
      CHECK_NO_MOCK_FAILURE();
      MockFailureReporterForTest::clearReporter();
      mock().clear();
  }